

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O2

void testRandom(void)

{
  int *piVar1;
  uint uVar2;
  int i;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Rand32 rand;
  int diffs [23];
  int values [11];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing random number generators");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"erand48(), nrand48()");
  std::endl<char,std::char_traits<char>>(poVar4);
  diffs[0] = 0x10000;
  diffs[1]._0_2_ = 2;
  dVar12 = (double)Imath_2_5::erand48((ushort *)diffs);
  if (1e-05 <= ABS(dVar12 + -0.671004)) {
    pcVar6 = "abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.671004) < 0.00001";
    uVar2 = 0x4a;
  }
  else {
    dVar12 = (double)Imath_2_5::erand48((ushort *)diffs);
    if (1e-05 <= ABS(dVar12 + -0.786905)) {
      pcVar6 = "abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.786905) < 0.00001";
      uVar2 = 0x4b;
    }
    else {
      dVar12 = (double)Imath_2_5::erand48((ushort *)diffs);
      if (1e-05 <= ABS(dVar12 + -0.31685)) {
        pcVar6 = "abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.316850) < 0.00001";
        uVar2 = 0x4c;
      }
      else {
        dVar12 = (double)Imath_2_5::erand48((ushort *)diffs);
        if (1e-05 <= ABS(dVar12 + -0.38487)) {
          pcVar6 = "abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.384870) < 0.00001";
          uVar2 = 0x4d;
        }
        else {
          dVar12 = (double)Imath_2_5::erand48((ushort *)diffs);
          if (1e-05 <= ABS(dVar12 + -0.85465)) {
            pcVar6 = "abs (IMATH_INTERNAL_NAMESPACE::erand48 (state) - 0.854650) < 0.00001";
            uVar2 = 0x4e;
          }
          else {
            lVar5 = Imath_2_5::nrand48((ushort *)diffs);
            if (lVar5 == 0x4f4e8cb0) {
              lVar5 = Imath_2_5::nrand48((ushort *)diffs);
              if (lVar5 == 0x63e864b) {
                lVar5 = Imath_2_5::nrand48((ushort *)diffs);
                if (lVar5 == 0x2d10f1dd) {
                  lVar5 = Imath_2_5::nrand48((ushort *)diffs);
                  if (lVar5 == 0x1aadc122) {
                    lVar5 = Imath_2_5::nrand48((ushort *)diffs);
                    if (lVar5 == 0x1836a71f) {
                      if ((short)diffs[0] == 0x2a42) {
                        if (diffs[0]._2_2_ == 0x4e3e) {
                          if ((short)diffs[1] == 0x306d) {
                            poVar4 = std::operator<<((ostream *)&std::cout,"Rand32");
                            std::endl<char,std::char_traits<char>>(poVar4);
                            for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
                              values[lVar5] = 0;
                            }
                            for (lVar5 = 2; lVar5 != 0x17; lVar5 = lVar5 + 1) {
                              diffs[lVar5] = 0;
                            }
                            rand._state = 0x5a5a5a5a;
                            iVar8 = 1000000;
                            fVar11 = 0.0;
                            while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
                              fVar10 = (float)Imath_2_5::Rand32::nextf();
                              fVar10 = (1.0 - fVar10) * 0.0 + fVar10;
                              values[(int)(fVar10 * 10.0)] = values[(int)(fVar10 * 10.0)] + 1;
                              iVar3 = Imath_2_5::floor<double>
                                                ((double)((fVar10 - fVar11) * 10.0) + 0.5);
                              diffs[(long)iVar3 + 0xc] = diffs[(long)iVar3 + 0xc] + 1;
                              fVar11 = fVar10;
                            }
                            poVar4 = std::operator<<((ostream *)&std::cout,"  values");
                            std::endl<char,std::char_traits<char>>(poVar4);
                            lVar5 = 0;
                            do {
                              if (lVar5 == 10) {
                                if (values[10] != 0) {
                                  pcVar6 = 
                                  "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]"
                                  ;
                                  goto LAB_00139dce;
                                }
                                poVar4 = std::operator<<((ostream *)&std::cout,
                                                         "  differences between successive values");
                                std::endl<char,std::char_traits<char>>(poVar4);
                                lVar5 = 0;
                                goto LAB_00139542;
                              }
                              uVar7 = values[lVar5] - 100000;
                              uVar2 = -uVar7;
                              if (0 < (int)uVar7) {
                                uVar2 = uVar7;
                              }
                              lVar5 = lVar5 + 1;
                            } while (uVar2 < 1000);
                            pcVar6 = 
                            "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]"
                            ;
LAB_00139834:
                            __assert_fail("abs (v[i] - M) < 0.01 * M",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                                          ,0x85,pcVar6);
                          }
                          pcVar6 = "state[2] == 0x306d";
                          uVar2 = 0x58;
                        }
                        else {
                          pcVar6 = "state[1] == 0x4e3e";
                          uVar2 = 0x57;
                        }
                      }
                      else {
                        pcVar6 = "state[0] == 0x2a42";
                        uVar2 = 0x56;
                      }
                    }
                    else {
                      pcVar6 = "IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1836a71f";
                      uVar2 = 0x54;
                    }
                  }
                  else {
                    pcVar6 = "IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x1aadc122";
                    uVar2 = 0x53;
                  }
                }
                else {
                  pcVar6 = "IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x2d10f1dd";
                  uVar2 = 0x52;
                }
              }
              else {
                pcVar6 = "IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x063e864b";
                uVar2 = 0x51;
              }
            }
            else {
              pcVar6 = "IMATH_INTERNAL_NAMESPACE::nrand48 (state) == 0x4f4e8cb0";
              uVar2 = 0x50;
            }
          }
        }
      }
    }
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                ,uVar2,"void (anonymous namespace)::testErand48()");
LAB_00139542:
  if (lVar5 == 0x15) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  range");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar8 = 0x989681;
    dVar12 = 0.0;
    dVar15 = 1.0;
    while (dVar14 = dVar12, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      fVar11 = (float)Imath_2_5::Rand32::nextf();
      dVar12 = (double)((1.0 - fVar11) * 0.0 + fVar11);
      dVar13 = dVar12;
      if (dVar15 <= dVar12) {
        dVar13 = dVar15;
      }
      dVar15 = dVar13;
      if (dVar12 <= dVar14) {
        dVar12 = dVar14;
      }
    }
    if ((0.0001 <= dVar15) || (dVar14 <= 0.9999)) {
      pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]";
LAB_00139ded:
      __assert_fail("rMin < 0.0001 && rMax > 0.9999",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0xac,pcVar6);
    }
    iVar8 = 0x989682;
    while (iVar8 = iVar8 + -1, iVar8 != 0) {
      fVar11 = Imath_2_5::Rand32::nextf(&rand,-2.0,3.0);
      if ((fVar11 < -2.0) || (3.0 < fVar11)) {
        pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]";
LAB_00139c23:
        __assert_fail("r0 >= -2.0 && r0 <= 3.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                      ,0xb3,pcVar6);
      }
      fVar11 = (float)Imath_2_5::Rand32::nextf();
      fVar11 = (1.0 - fVar11) * -1.1529215e+18 + fVar11;
      if ((fVar11 < -1.1529215e+18) || (1.0 < fVar11)) {
        pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]";
LAB_00139c04:
        __assert_fail("r1 >= -pow_2_60 && r1 <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                      ,0xb6,pcVar6);
      }
      fVar11 = Imath_2_5::Rand32::nextf(&rand,-1.0,1.1529215e+18);
      if ((fVar11 < -1.0) || (1.1529215e+18 < fVar11)) {
        pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]";
LAB_00139a28:
        __assert_fail("r2 >= -1 && r2 <= pow_2_60",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                      ,0xb9,pcVar6);
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Rand48");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
      values[lVar5] = 0;
    }
    for (lVar5 = 2; lVar5 != 0x17; lVar5 = lVar5 + 1) {
      diffs[lVar5] = 0;
    }
    rand._state._0_6_ = 0x5a5a5a5a5a5a;
    iVar8 = 1000000;
    fVar11 = 0.0;
    while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
      dVar12 = (double)Imath_2_5::erand48((ushort *)&rand);
      fVar10 = (float)((1.0 - dVar12) * 0.0 + dVar12);
      values[(int)(fVar10 * 10.0)] = values[(int)(fVar10 * 10.0)] + 1;
      iVar3 = Imath_2_5::floor<double>((double)((fVar10 - fVar11) * 10.0) + 0.5);
      diffs[(long)iVar3 + 0xc] = diffs[(long)iVar3 + 0xc] + 1;
      fVar11 = fVar10;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"  values");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar5 = 0;
    do {
      if (lVar5 == 10) {
        if (values[10] != 0) {
          pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
LAB_00139dce:
          __assert_fail("v[N] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                        ,0x8d,pcVar6);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"  differences between successive values");
        std::endl<char,std::char_traits<char>>(poVar4);
        lVar5 = 0;
        do {
          if (lVar5 == 0x15) {
            poVar4 = std::operator<<((ostream *)&std::cout,"  range");
            std::endl<char,std::char_traits<char>>(poVar4);
            iVar8 = 0x989681;
            dVar12 = 0.0;
            dVar15 = 1.0;
            while (dVar14 = dVar12, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
              dVar12 = (double)Imath_2_5::erand48((ushort *)&rand);
              dVar12 = (1.0 - dVar12) * 0.0 + dVar12;
              dVar13 = dVar12;
              if (dVar15 <= dVar12) {
                dVar13 = dVar15;
              }
              dVar15 = dVar13;
              if (dVar12 <= dVar14) {
                dVar12 = dVar14;
              }
            }
            if ((0.0001 <= dVar15) || (dVar14 <= 0.9999)) {
              pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
              goto LAB_00139ded;
            }
            iVar8 = 0x989682;
            do {
              iVar8 = iVar8 + -1;
              if (iVar8 == 0) {
                poVar4 = std::operator<<((ostream *)&std::cout,"solidSphereRand()");
                std::endl<char,std::char_traits<char>>(poVar4);
                for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
                  diffs[lVar5] = 0;
                }
                rand._state = 0x5a5a5a5a;
                iVar8 = 100000;
                do {
                  bVar9 = iVar8 == 0;
                  iVar8 = iVar8 + -1;
                  if (bVar9) {
                    lVar5 = 0;
                    do {
                      if (lVar5 == 10) {
                        poVar4 = std::operator<<((ostream *)&std::cout,"hollowSphereRand()");
                        std::endl<char,std::char_traits<char>>(poVar4);
                        values[0] = 0x5a5a5a5a;
                        values[1] = 0;
                        iVar8 = 100000;
                        do {
                          bVar9 = iVar8 == 0;
                          iVar8 = iVar8 + -1;
                          if (bVar9) {
                            poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
                            std::endl<char,std::char_traits<char>>(poVar4);
                            return;
                          }
                          Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>
                                    ((Imath_2_5 *)diffs,(Rand32 *)values);
                          fVar11 = Imath_2_5::Vec3<float>::length((Vec3<float> *)diffs);
                        } while (ABS(fVar11 + -1.0) < 1e-05);
                        __assert_fail("abs (l - 1) < 0.00001",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                                      ,0xe5,
                                      "void (anonymous namespace)::testHollowSphere() [Rand = Imath_2_5::Rand32]"
                                     );
                      }
                      piVar1 = diffs + lVar5;
                      lVar5 = lVar5 + 1;
                    } while (0 < *piVar1);
                    __assert_fail("v[i] > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                                  ,0xd5,
                                  "void (anonymous namespace)::testSolidSphere() [Rand = Imath_2_5::Rand32]"
                                 );
                  }
                  Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>
                            ((Imath_2_5 *)values,&rand);
                  fVar11 = Imath_2_5::Vec3<float>::length((Vec3<float> *)values);
                  iVar3 = Imath_2_5::floor<float>(fVar11 * 10.0);
                  diffs[iVar3] = diffs[iVar3] + 1;
                } while (fVar11 < 1.00001);
                __assert_fail("l < 1.00001",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                              ,0xd1,
                              "void (anonymous namespace)::testSolidSphere() [Rand = Imath_2_5::Rand32]"
                             );
              }
              dVar12 = Imath_2_5::Rand48::nextf((Rand48 *)&rand,-2.0,3.0);
              if ((dVar12 < -2.0) || (3.0 < dVar12)) {
                pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
                goto LAB_00139c23;
              }
              dVar12 = (double)Imath_2_5::erand48((ushort *)&rand);
              dVar12 = (1.0 - dVar12) * -1.152921504606847e+18 + dVar12;
              if ((dVar12 < -1.152921504606847e+18) || (1.0 < dVar12)) {
                pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
                goto LAB_00139c04;
              }
              dVar12 = Imath_2_5::Rand48::nextf((Rand48 *)&rand,-1.0,1.152921504606847e+18);
            } while ((-1.0 <= dVar12) && (dVar12 <= 1.152921504606847e+18));
            pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
            goto LAB_00139a28;
          }
          iVar3 = (int)lVar5 + -10;
          iVar8 = -iVar3;
          if (iVar3 < 1) {
            iVar8 = iVar3;
          }
          uVar7 = (iVar8 * 10000 - diffs[lVar5 + 2]) + 100000;
          uVar2 = -uVar7;
          if (0 < (int)uVar7) {
            uVar2 = uVar7;
          }
          lVar5 = lVar5 + 1;
        } while (uVar2 < 5000);
        pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
        goto LAB_001398b0;
      }
      uVar7 = values[lVar5] - 100000;
      uVar2 = -uVar7;
      if (0 < (int)uVar7) {
        uVar2 = uVar7;
      }
      lVar5 = lVar5 + 1;
    } while (uVar2 < 1000);
    pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand48]";
    goto LAB_00139834;
  }
  iVar3 = (int)lVar5 + -10;
  iVar8 = -iVar3;
  if (iVar3 < 1) {
    iVar8 = iVar3;
  }
  uVar7 = (iVar8 * 10000 - diffs[lVar5 + 2]) + 100000;
  uVar2 = -uVar7;
  if (0 < (int)uVar7) {
    uVar2 = uVar7;
  }
  lVar5 = lVar5 + 1;
  if (4999 < uVar2) {
    pcVar6 = "void (anonymous namespace)::testGenerator() [Rand = Imath_2_5::Rand32]";
LAB_001398b0:
    __assert_fail("abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                  ,0x94,pcVar6);
  }
  goto LAB_00139542;
}

Assistant:

void
testRandom ()
{
    cout << "Testing random number generators" << endl;

    cout << "erand48(), nrand48()" << endl;
    testErand48();

    cout << "Rand32" << endl;
    testGenerator<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "Rand48" << endl;
    testGenerator<IMATH_INTERNAL_NAMESPACE::Rand48>();

    cout << "solidSphereRand()" << endl;
    testSolidSphere<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "hollowSphereRand()" << endl;
    testHollowSphere<IMATH_INTERNAL_NAMESPACE::Rand32>();

    cout << "ok\n" << endl;
}